

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter>_>::
disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter>_>
            *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    TimerImpl::TimerPromiseAdapter::~TimerPromiseAdapter
              ((TimerPromiseAdapter *)((long)pointer + 0x188));
    if (*(char *)((long)pointer + 0x18) == '\x01') {
      Exception::~Exception((Exception *)((long)pointer + 0x20));
    }
    operator_delete(pointer,0x1a8);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }